

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O0

void __thiscall QBoxLayout::insertStretch(QBoxLayout *this,int index,int stretch)

{
  bool bVar1;
  QBoxLayoutPrivate *pQVar2;
  QBoxLayoutItem *this_00;
  int in_EDX;
  undefined4 in_ESI;
  QList<QBoxLayoutItem_*> *in_RDI;
  QBoxLayoutItem *it;
  QLayoutItem *b;
  QBoxLayoutPrivate *d;
  Policy hPolicy;
  undefined8 in_stack_ffffffffffffffd0;
  int w;
  QLayout *in_stack_ffffffffffffffd8;
  QSpacerItem *local_20;
  
  pQVar2 = d_func((QBoxLayout *)0x2f5444);
  QBoxLayoutPrivate::validateIndex
            ((QBoxLayoutPrivate *)CONCAT44(in_ESI,in_EDX),(int)((ulong)pQVar2 >> 0x20));
  bVar1 = horz(pQVar2->dir);
  hPolicy = (Policy)((ulong)in_RDI >> 0x20);
  w = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  if (bVar1) {
    local_20 = QLayoutPrivate::createSpacerItem
                         (in_stack_ffffffffffffffd8,w,(int)in_stack_ffffffffffffffd0,hPolicy,
                          (Policy)in_RDI);
  }
  else {
    local_20 = QLayoutPrivate::createSpacerItem
                         (in_stack_ffffffffffffffd8,w,(int)in_stack_ffffffffffffffd0,hPolicy,
                          (Policy)in_RDI);
  }
  this_00 = (QBoxLayoutItem *)operator_new(0x10);
  QBoxLayoutItem::QBoxLayoutItem(this_00,&local_20->super_QLayoutItem,in_EDX);
  this_00->magic = true;
  QList<QBoxLayoutItem_*>::insert(in_RDI,(qsizetype)this_00,this_00);
  (**(code **)&(in_RDI->d).d[7].super_QArrayData)();
  return;
}

Assistant:

void QBoxLayout::insertStretch(int index, int stretch)
{
    Q_D(QBoxLayout);
    index = d->validateIndex(index);
    QLayoutItem *b;
    if (horz(d->dir))
        b = QLayoutPrivate::createSpacerItem(this, 0, 0, QSizePolicy::Expanding, QSizePolicy::Minimum);
    else
        b = QLayoutPrivate::createSpacerItem(this, 0, 0, QSizePolicy::Minimum, QSizePolicy::Expanding);

    QBoxLayoutItem *it = new QBoxLayoutItem(b, stretch);
    it->magic = true;
    d->list.insert(index, it);
    invalidate();
}